

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::encode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,uint w,
                    uint h,State *state)

{
  uint uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  uchar *in_R8;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGState *in_stack_000005d0;
  uint in_stack_000005d8;
  uint in_stack_000005dc;
  uchar *in_stack_000005e0;
  size_t *in_stack_000005e8;
  uchar **in_stack_000005f0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffb0;
  undefined8 local_28;
  const_iterator __position;
  
  uVar1 = lodepng_encode(in_stack_000005f0,in_stack_000005e8,in_stack_000005e0,in_stack_000005dc,
                         in_stack_000005d8,in_stack_000005d0);
  if (local_28 != 0) {
    __position._M_current = (uchar *)in_RDI;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_RDI);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_ffffffffffffffb0,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_RDI);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              (in_RSI,__position,(uchar *)CONCAT44(in_EDX,in_ECX),in_R8);
    lodepng_free((void *)0x16d75c);
  }
  return uVar1;
}

Assistant:

unsigned encode(std::vector<unsigned char>& out,
    const unsigned char* in, unsigned w, unsigned h,
    State& state) {
    unsigned char* buffer;
    size_t buffersize;
    unsigned error = lodepng_encode(&buffer, &buffersize, in, w, h, &state);
    if (buffer) {
      out.insert(out.end(), &buffer[0], &buffer[buffersize]);
      lodepng_free(buffer);
    }
    return error;
  }